

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool CLI::detail::process_quoted_string(string *str,char string_char,char literal_char)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  char in_DL;
  char in_SIL;
  string *in_RDI;
  string *in_stack_000001d8;
  string *in_stack_ffffffffffffffa8;
  string local_38 [23];
  char in_stack_ffffffffffffffdf;
  string *in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar3 = ::std::__cxx11::string::size();
  if (uVar3 < 2) {
    return false;
  }
  bVar2 = is_binary_escaped_string(in_stack_ffffffffffffffa8);
  if (!bVar2) {
    pcVar4 = (char *)::std::__cxx11::string::front();
    if ((*pcVar4 == in_SIL) && (pcVar4 = (char *)::std::__cxx11::string::back(), *pcVar4 == in_SIL))
    {
      remove_outer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
      lVar5 = ::std::__cxx11::string::find_first_of((char)in_RDI,0x5c);
      if (lVar5 != -1) {
        remove_escaped_characters(in_stack_000001d8);
        ::std::__cxx11::string::operator=((string *)in_RDI,(string *)&stack0xffffffffffffffa8);
        ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
      }
      handle_secondary_array(in_RDI);
      return true;
    }
    pcVar4 = (char *)::std::__cxx11::string::front();
    if ((*pcVar4 == in_DL) || (pcVar4 = (char *)::std::__cxx11::string::front(), *pcVar4 == '`')) {
      pcVar4 = (char *)::std::__cxx11::string::back();
      cVar1 = *pcVar4;
      pcVar4 = (char *)::std::__cxx11::string::front();
      if (cVar1 == *pcVar4) {
        ::std::__cxx11::string::front();
        remove_outer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
        handle_secondary_array(in_RDI);
        return true;
      }
    }
    return false;
  }
  extract_binary_string((string *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  ::std::__cxx11::string::operator=((string *)in_RDI,local_38);
  ::std::__cxx11::string::~string(local_38);
  handle_secondary_array(in_RDI);
  return true;
}

Assistant:

CLI11_INLINE bool process_quoted_string(std::string &str, char string_char, char literal_char) {
    if(str.size() <= 1) {
        return false;
    }
    if(detail::is_binary_escaped_string(str)) {
        str = detail::extract_binary_string(str);
        handle_secondary_array(str);
        return true;
    }
    if(str.front() == string_char && str.back() == string_char) {
        detail::remove_outer(str, string_char);
        if(str.find_first_of('\\') != std::string::npos) {
            str = detail::remove_escaped_characters(str);
        }
        handle_secondary_array(str);
        return true;
    }
    if((str.front() == literal_char || str.front() == '`') && str.back() == str.front()) {
        detail::remove_outer(str, str.front());
        handle_secondary_array(str);
        return true;
    }
    return false;
}